

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

bool __thiscall
boost::ext::ut::v1_1_8::runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>
::filter::operator()
          (void *this,size_t level,
          array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL> *path)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  string_view input;
  string_view pattern;
  
  uVar3 = 0;
  do {
    lVar1 = *this;
    uVar4 = (ulong)uVar3;
    uVar5 = *(long *)((long)this + 8) - lVar1 >> 4;
    if (level + 1 <= uVar5) {
      uVar5 = level + 1;
    }
    if (uVar5 <= uVar4) break;
    input._M_str = path->_M_elems[uVar4]._M_str;
    input._M_len = path->_M_elems[uVar4]._M_len;
    pattern._M_str = *(char **)(lVar1 + 8 + uVar4 * 0x10);
    pattern._M_len = *(size_t *)(lVar1 + uVar4 * 0x10);
    bVar2 = utility::is_match(input,pattern);
    uVar3 = uVar3 + 1;
  } while (bVar2);
  return uVar5 <= uVar4;
}

Assistant:

constexpr auto operator()(const std::size_t level,
                                const TPath& path) const -> bool {
        for (auto i = 0u; i < math::min_value(level + 1, std::size(path_));
             ++i) {
          if (not utility::is_match(path[i], path_[i])) {
            return false;
          }
        }
        return true;
      }